

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadMultipleBlocksToBlob
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK getDataCallback,void *context)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  UPLOAD_MULTIPLE_BLOCKS_WRAPPER_CONTEXT uploadMultipleBlocksWrapperContext;
  
  if ((destinationFileName == (char *)0x0 || iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0
      ) || getDataCallback == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb19,1,
                "invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, const char* destinationFileName=%p, getDataCallback=%p"
                ,iotHubClientHandle,destinationFileName,getDataCallback);
    }
  }
  else {
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,
                       &uploadCorrelationId,&azureBlobSasUri);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      azureStorageClientHandle =
           IoTHubClient_LL_UploadToBlob_CreateContext
                     (iotHubClientHandle->uploadToBlobHandle,azureBlobSasUri);
      if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb2e,1,
                    "Failed creating upload to blob context");
        }
      }
      else {
        uploadMultipleBlocksWrapperContext.getDataCallback = getDataCallback;
        uploadMultipleBlocksWrapperContext.context = context;
        IVar1 = IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
                          (azureStorageClientHandle,uploadMultipleBlocksCallbackWrapper,
                           &uploadMultipleBlocksWrapperContext);
        if (IVar1 != IOTHUB_CLIENT_OK) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb3a,1,
                      "Failed to upload multiple blocks to Azure blob");
          }
        }
        IoTHubClient_LL_UploadToBlob_DestroyContext(azureStorageClientHandle);
      }
      IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (iotHubClientHandle->uploadToBlobHandle,uploadCorrelationId,false,400,
                         (char *)0x0);
      if (IVar1 != IOTHUB_CLIENT_OK) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb49,1,
                    "Failed completing upload to blob.");
        }
      }
      free(uploadCorrelationId);
      free(azureBlobSasUri);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb24,1,
                  "Failed initializing upload in IoT Hub");
      }
    }
    IVar1 = IOTHUB_CLIENT_ERROR;
  }
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadMultipleBlocksToBlob(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK getDataCallback, void* context)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        (getDataCallback == NULL)
        )
    {
        LogError("invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, const char* destinationFileName=%p, getDataCallback=%p", iotHubClientHandle, destinationFileName, getDataCallback);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId;
        char* azureBlobSasUri;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                UPLOAD_MULTIPLE_BLOCKS_WRAPPER_CONTEXT uploadMultipleBlocksWrapperContext;
                uploadMultipleBlocksWrapperContext.getDataCallback = getDataCallback;
                uploadMultipleBlocksWrapperContext.context = context;

                if (IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(
                        uploadContext, uploadMultipleBlocksCallbackWrapper, &uploadMultipleBlocksWrapperContext) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed to upload multiple blocks to Azure blob");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = false;
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            // TODO (ewertons): fix the http error status below.
            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded, 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }
    
    return result;
}